

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Resupply_Received_PDU::Encode(Resupply_Received_PDU *this,KDataStream *stream)

{
  pointer pSVar1;
  pointer pSVar2;
  
  Logistics_Header::Encode(&this->super_Logistics_Header,stream);
  KDataStream::Write(stream,this->m_ui8NumSupplyTypes);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding2);
  pSVar1 = (this->m_vSupplies).
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->m_vSupplies).
                super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    (*(pSVar2->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[5])(pSVar2,stream);
  }
  return;
}

Assistant:

void Resupply_Received_PDU::Encode( KDataStream & stream ) const
{
    Logistics_Header::Encode( stream );
    stream << m_ui8NumSupplyTypes
           << m_ui16Padding1
           << m_ui8Padding2;

    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}